

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O0

void __thiscall
Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>::
Compressed_distance_matrix
          (Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0> *this,
          vector<float,_std::allocator<float>_> *_distances)

{
  vertex_t vVar1;
  vertex_t vVar2;
  size_type sVar3;
  ulong uVar4;
  logic_error *this_00;
  __type _Var5;
  double dVar6;
  allocator<float_*> local_25 [13];
  vector<float,_std::allocator<float>_> *local_18;
  vector<float,_std::allocator<float>_> *_distances_local;
  Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0> *this_local;
  
  local_18 = _distances;
  _distances_local = &this->distances;
  std::vector<float,_std::allocator<float>_>::vector(&this->distances,_distances);
  sVar3 = std::vector<float,_std::allocator<float>_>::size(&this->distances);
  _Var5 = std::sqrt<unsigned_long>(sVar3 * 8 + 1);
  dVar6 = (_Var5 + 1.0) * 0.5;
  uVar4 = (ulong)dVar6;
  std::allocator<float_*>::allocator(local_25);
  std::vector<float_*,_std::allocator<float_*>_>::vector
            (&this->rows,uVar4 | (long)(dVar6 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f,
             local_25);
  std::allocator<float_*>::~allocator(local_25);
  sVar3 = std::vector<float,_std::allocator<float>_>::size(&this->distances);
  vVar1 = size(this);
  vVar2 = size(this);
  if (sVar3 == (ulong)((long)vVar1 * (long)(vVar2 + -1)) >> 1) {
    init_rows(this);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Compressed_distance_matrix(std::vector<value_t>&& _distances)
      : distances(std::move(_distances)), rows((1 + std::sqrt(1 + 8 * distances.size())) / 2) {
        GUDHI_assert(distances.size() == (std::size_t)size() * (size() - 1) / 2);
        init_rows();
      }